

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l_00;
  uint32_t ty_id;
  bool bVar1;
  StorageClass storage_class_00;
  uint32_t uVar2;
  Op OVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  IRContext *pIVar6;
  TypeManager *this_00;
  Instruction *pIVar7;
  reference ppVar8;
  Operand *pOVar9;
  pointer inst;
  reference d;
  undefined1 assert_found_terminating_null;
  bool bVar10;
  bool is_old_var_struct;
  Operand *local_3b0;
  Operand *local_370;
  uint32_t local_368;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *new_name_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *__range2_1;
  Instruction *new_name_inst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_320;
  SmallVector<unsigned_int,_2UL> local_308;
  uint32_t local_2dc;
  iterator local_2d8;
  undefined8 local_2d0;
  SmallVector<unsigned_int,_2UL> local_2c8;
  Operand local_2a0;
  Operand OStack_270;
  iterator local_240;
  _func_int **local_238;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_230;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_218
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_name;
  string local_1f0;
  Instruction *local_1d0;
  Instruction *member_name_inst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string name_str;
  Instruction *name_inst;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> p;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __end2;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __begin2;
  IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *__range2;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  SmallVector<unsigned_int,_2UL> local_d8;
  Operand local_b0;
  iterator local_80;
  _func_int **local_78;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_70;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_58;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> variable;
  uint32_t id;
  uint32_t ptr_element_type_id;
  uint32_t element_type_id;
  bool is_struct;
  bool is_array;
  Instruction *pointee_type_inst;
  uint32_t pointee_type_id;
  Instruction *ptr_type_inst;
  uint32_t ptr_type_id;
  StorageClass storage_class;
  uint32_t idx_local;
  Instruction *var_local;
  DescriptorScalarReplacement *this_local;
  
  storage_class_00 = opt::Instruction::GetSingleWordInOperand(var,0);
  uVar2 = opt::Instruction::type_id(var);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  OVar3 = opt::Instruction::opcode(pIVar5);
  if (OVar3 != OpTypePointer) {
    __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x129,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar2 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  OVar3 = opt::Instruction::opcode(pIVar5);
  bVar10 = OVar3 == OpTypeArray;
  OVar3 = opt::Instruction::opcode(pIVar5);
  is_old_var_struct = OVar3 == OpTypeStruct;
  if ((bVar10) || (bVar1 = false, is_old_var_struct)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(is_array || is_struct) && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x12f,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  if (bVar10) {
    local_368 = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
  }
  else {
    local_368 = opt::Instruction::GetSingleWordInOperand(pIVar5,idx);
  }
  pIVar6 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar6);
  variable._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       analysis::TypeManager::FindPointerToType(this_00,local_368,storage_class_00);
  variable._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       Pass::TakeNextId(&this->super_Pass);
  pIVar7 = (Instruction *)::operator_new(0x70);
  pIVar6 = Pass::context(&this->super_Pass);
  ty_id = variable._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  uVar2 = (uint32_t)
          variable._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  init_list_00._M_len = 1;
  init_list_00._M_array =
       (iterator)
       ((long)&names_to_add.
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = storage_class_00;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_00);
  Operand::Operand(&local_b0,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_d8);
  local_80 = &local_b0;
  local_78 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)
             ((long)&names_to_add.
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  __l_00._M_len = (size_type)local_78;
  __l_00._M_array = local_80;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_70,__l_00,
             (allocator_type *)
             ((long)&names_to_add.
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  opt::Instruction::Instruction(pIVar7,pIVar6,OpVariable,ty_id,uVar2,&local_70);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_58,pIVar7);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_70);
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)
             ((long)&names_to_add.
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_370 = (Operand *)&local_80;
  do {
    local_370 = local_370 + -1;
    Operand::~Operand(local_370);
  } while (local_370 != &local_b0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
  pIVar6 = Pass::context(&this->super_Pass);
  IRContext::AddGlobalValue(pIVar6,&local_58);
  CopyDecorationsForNewVariable
            (this,var,idx,
             (uint32_t)
             variable._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
             variable._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_,bVar10,
             is_old_var_struct,pIVar5);
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            *)&__range2);
  pIVar6 = Pass::context(&this->super_Pass);
  uVar2 = opt::Instruction::result_id(var);
  ___begin2 = IRContext::GetNames(pIVar6,uVar2);
  __end2 = IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::begin((IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                    *)&__begin2);
  p.second = (Instruction *)
             IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
             ::end((IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                    *)&__begin2);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&p.second), bVar1) {
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::
             operator*(&__end2);
    assert_found_terminating_null = (undefined1)*(undefined8 *)ppVar8;
    name_str.field_2._8_8_ = ppVar8->second;
    p._0_8_ = name_str.field_2._8_8_;
    pOVar9 = opt::Instruction::GetOperand((Instruction *)name_str.field_2._8_8_,1);
    utils::MakeString<spvtools::utils::SmallVector<unsigned_int,2ul>>
              ((string *)local_168,(utils *)&pOVar9->words,(SmallVector<unsigned_int,_2UL> *)0x1,
               (bool)assert_found_terminating_null);
    if (bVar10) {
      utils::ToString<unsigned_int>((string *)&member_name_inst,idx);
      std::operator+(&local_1a8,"[",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &member_name_inst);
      std::operator+(&local_188,&local_1a8,"]");
      std::__cxx11::string::operator+=((string *)local_168,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&member_name_inst);
    }
    if (is_old_var_struct) {
      pIVar6 = Pass::context(&this->super_Pass);
      uVar2 = opt::Instruction::result_id(pIVar5);
      local_1d0 = IRContext::GetMemberName(pIVar6,uVar2,idx);
      std::__cxx11::string::operator+=((string *)local_168,".");
      if (local_1d0 == (Instruction *)0x0) {
        utils::ToString<unsigned_int>((string *)&new_name,idx);
        std::__cxx11::string::operator+=((string *)local_168,(string *)&new_name);
        std::__cxx11::string::~string((string *)&new_name);
      }
      else {
        pOVar9 = opt::Instruction::GetOperand(local_1d0,2);
        utils::MakeString<spvtools::utils::SmallVector<unsigned_int,2ul>>
                  (&local_1f0,(utils *)&pOVar9->words,(SmallVector<unsigned_int,_2UL> *)0x1,
                   (bool)assert_found_terminating_null);
        std::__cxx11::string::operator+=((string *)local_168,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
    }
    pIVar7 = (Instruction *)::operator_new(0x70);
    pIVar6 = Pass::context(&this->super_Pass);
    local_2dc = (uint32_t)
                variable._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    local_2d8 = &local_2dc;
    local_2d0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_2d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c8,init_list);
    Operand::Operand(&local_2a0,SPV_OPERAND_TYPE_ID,&local_2c8);
    utils::MakeVector(&local_320,(string *)local_168);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_308,&local_320);
    Operand::Operand(&OStack_270,SPV_OPERAND_TYPE_LITERAL_STRING,&local_308);
    local_240 = &local_2a0;
    local_238 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&new_name_inst + 7));
    __l._M_len = (size_type)local_238;
    __l._M_array = local_240;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_230,__l,(allocator_type *)((long)&new_name_inst + 7));
    opt::Instruction::Instruction(pIVar7,pIVar6,OpName,0,0,&local_230);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_218,pIVar7);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_230);
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&new_name_inst + 7));
    local_3b0 = (Operand *)&local_240;
    do {
      local_3b0 = local_3b0 + -1;
      Operand::~Operand(local_3b0);
    } while (local_3b0 != &local_2a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_308);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_320);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c8);
    inst = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&local_218);
    pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstDefUse(pDVar4,inst);
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::push_back((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 *)&__range2,&local_218);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_218);
    std::__cxx11::string::~string((string *)local_168);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::operator++
              (&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ::begin((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                      *)&__range2);
  new_name_1 = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)std::
                  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ::end((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                         *)&__range2);
  while (bVar10 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
                              *)&new_name_1),
        uVar2 = (uint32_t)
                variable._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl, bVar10) {
    d = __gnu_cxx::
        __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
        ::operator*(&__end2_1);
    pIVar6 = Pass::context(&this->super_Pass);
    IRContext::AddDebug2Inst(pIVar6,d);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             *)&__range2);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_58);
  return uVar2;
}

Assistant:

uint32_t DescriptorScalarReplacement::CreateReplacementVariable(
    Instruction* var, uint32_t idx) {
  // The storage class for the new variable is the same as the original.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(var->GetSingleWordInOperand(0));

  // The type for the new variable will be a pointer to type of the elements of
  // the array.
  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable should be a pointer to an array or structure.");
  uint32_t pointee_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst = get_def_use_mgr()->GetDef(pointee_type_id);
  const bool is_array = pointee_type_inst->opcode() == spv::Op::OpTypeArray;
  const bool is_struct = pointee_type_inst->opcode() == spv::Op::OpTypeStruct;
  assert((is_array || is_struct) &&
         "Variable should be a pointer to an array or structure.");

  uint32_t element_type_id =
      is_array ? pointee_type_inst->GetSingleWordInOperand(0)
               : pointee_type_inst->GetSingleWordInOperand(idx);

  uint32_t ptr_element_type_id = context()->get_type_mgr()->FindPointerToType(
      element_type_id, storage_class);

  // Create the variable.
  uint32_t id = TakeNextId();
  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_element_type_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {static_cast<uint32_t>(storage_class)}}}));
  context()->AddGlobalValue(std::move(variable));

  CopyDecorationsForNewVariable(var, idx, id, ptr_element_type_id, is_array,
                                is_struct, pointee_type_inst);

  // Create a new OpName for the replacement variable.
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  for (auto p : context()->GetNames(var->result_id())) {
    Instruction* name_inst = p.second;
    std::string name_str = utils::MakeString(name_inst->GetOperand(1).words);
    if (is_array) {
      name_str += "[" + utils::ToString(idx) + "]";
    }
    if (is_struct) {
      Instruction* member_name_inst =
          context()->GetMemberName(pointee_type_inst->result_id(), idx);
      name_str += ".";
      if (member_name_inst)
        name_str += utils::MakeString(member_name_inst->GetOperand(2).words);
      else
        // In case the member does not have a name assigned to it, use the
        // member index.
        name_str += utils::ToString(idx);
    }

    std::unique_ptr<Instruction> new_name(new Instruction(
        context(), spv::Op::OpName, 0, 0,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {id}},
            {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}}));
    Instruction* new_name_inst = new_name.get();
    get_def_use_mgr()->AnalyzeInstDefUse(new_name_inst);
    names_to_add.push_back(std::move(new_name));
  }

  // We shouldn't add the new names when we are iterating over name ranges
  // above. We can add all the new names now.
  for (auto& new_name : names_to_add)
    context()->AddDebug2Inst(std::move(new_name));

  return id;
}